

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<wchar_t>::add_node
          (CATNMachine<wchar_t> *this,CharClass<wchar_t> *cc,int origin,int tag)

{
  pointer pCVar1;
  pointer pCVar2;
  bool local_19;
  int local_18;
  int local_14;
  
  pCVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (-1 < origin && pCVar1 != pCVar2) {
    local_14 = (int)((ulong)((long)pCVar2 - (long)pCVar1) >> 4) * -0x33333333;
    local_19 = false;
    local_18 = tag;
    std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
    ::emplace_back<Centaurus::CharClass<wchar_t>const&,int&,bool,int&>
              ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
                *)&pCVar1[(uint)origin].m_transitions,cc,&local_14,&local_19,&local_18);
  }
  std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
  emplace_back<>(&this->m_nodes);
  return (int)((ulong)((long)(this->m_nodes).
                             super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_nodes).
                            super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 + -1;
}

Assistant:

int add_node(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        if (!m_nodes.empty() && origin >= 0)
            m_nodes[origin].add_transition(cc, m_nodes.size(), tag);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }